

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O0

void bsp_remove_point_by_idx(void *handle,int idx)

{
  void *handle_00;
  int in_ESI;
  long *in_RDI;
  int i;
  float *point;
  bsp_tree *tree;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  
  handle_00 = malloc((ulong)*(byte *)(in_RDI + 1) << 2);
  for (iVar1 = 0; iVar1 < (int)(uint)*(byte *)(in_RDI + 1); iVar1 = iVar1 + 1) {
    *(undefined4 *)((long)handle_00 + (long)iVar1 * 4) =
         *(undefined4 *)(*(long *)(*in_RDI + (long)iVar1 * 8) + (long)in_ESI * 4);
  }
  bsp_remove_point(handle_00,(float *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
  free(handle_00);
  return;
}

Assistant:

void
bsp_remove_point_by_idx(
    void * handle,
    int idx )
{
    bsp_tree * tree;
    float * point;
    int i;
    tree = (bsp_tree *) handle;
    assert( tree != NULL );
    point = (float *)malloc( sizeof(float) * tree->dimensions );
    assert( point != NULL );
    for ( i = 0; i < tree->dimensions; i++ ) {
        point[i] = tree->pointarrays[i][idx];
    }
    bsp_remove_point( handle, point );
    free( point );
}